

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<mp::LogicalConstant>::Matcher
          (Matcher<mp::LogicalConstant> *this,LogicalConstant value)

{
  EqMatcher<mp::LogicalConstant> this_00;
  ExprBase in_RDI;
  EqMatcher<mp::LogicalConstant> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::LogicalConstant>::MatcherBase
            ((MatcherBase<mp::LogicalConstant> *)0x15849c);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_0029ff68;
  this_00 = Eq<mp::LogicalConstant>((LogicalConstant)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::LogicalConstant> *)
            this_00.rhs_.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
            impl_,(Matcher<mp::LogicalConstant> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::LogicalConstant> *)0x1584fa);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }